

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool __thiscall leveldb::Version::UpdateStats(Version *this,GetStats *stats)

{
  FileMetaData *pFVar1;
  FileMetaData *f;
  GetStats *stats_local;
  Version *this_local;
  
  pFVar1 = stats->seek_file;
  if (((pFVar1 == (FileMetaData *)0x0) ||
      (pFVar1->allowed_seeks = pFVar1->allowed_seeks + -1, 0 < pFVar1->allowed_seeks)) ||
     (this->file_to_compact_ != (FileMetaData *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    this->file_to_compact_ = pFVar1;
    this->file_to_compact_level_ = stats->seek_file_level;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Version::UpdateStats(const GetStats& stats) {
  FileMetaData* f = stats.seek_file;
  if (f != nullptr) {
    f->allowed_seeks--;
    if (f->allowed_seeks <= 0 && file_to_compact_ == nullptr) {
      file_to_compact_ = f;
      file_to_compact_level_ = stats.seek_file_level;
      return true;
    }
  }
  return false;
}